

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

parameter * __thiscall
clipp::option<char_const(&)[3],char_const(&)[8]>
          (parameter *__return_storage_ptr__,clipp *this,char (*flag) [3],char (*flags) [8])

{
  parameter *ppVar1;
  allocator<char> local_141;
  arg_string local_140;
  parameter local_120;
  char (*local_20) [8];
  char (*flags_local) [8];
  char (*flag_local) [3];
  
  local_20 = (char (*) [8])flag;
  flags_local = (char (*) [8])this;
  flag_local = (char (*) [3])__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,(char *)this,&local_141);
  parameter::parameter<char_const(&)[8]>(&local_120,&local_140,local_20);
  ppVar1 = parameter::required(&local_120,false);
  ppVar1 = detail::token<clipp::parameter>::blocking(&ppVar1->super_token<clipp::parameter>,false);
  ppVar1 = detail::token<clipp::parameter>::repeatable(&ppVar1->super_token<clipp::parameter>,false)
  ;
  parameter::parameter(__return_storage_ptr__,ppVar1);
  parameter::~parameter(&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  return __return_storage_ptr__;
}

Assistant:

inline parameter
option(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(false).blocking(false).repeatable(false);
}